

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

ssize_t zip_entry_mark(zip_t *zip,zip_entry_mark_t *entry_mark,size_t n,char **entries,size_t len)

{
  bool bVar1;
  int iVar2;
  mz_bool mVar3;
  ulong local_4b8;
  size_t j;
  mz_uint64 mStack_4a8;
  mz_bool name_matches;
  mz_uint64 d_pos;
  mz_zip_archive_file_stat file_stat;
  ssize_t err;
  size_t i;
  size_t len_local;
  char **entries_local;
  size_t n_local;
  zip_entry_mark_t *entry_mark_local;
  zip_t *zip_local;
  
  file_stat.m_time = 0;
  if (((zip == (zip_t *)0x0) || (entry_mark == (zip_entry_mark_t *)0x0)) ||
     (entries == (char **)0x0)) {
    zip_local = (zip_t *)0xffffffffffffffff;
  }
  else {
    mStack_4a8 = 0xffffffffffffffff;
    for (err = 0; (ulong)err < n; err = err + 1) {
      iVar2 = zip_entry_openbyindex(zip,err);
      if ((long)iVar2 != 0) {
        return (long)iVar2;
      }
      bVar1 = false;
      file_stat.m_time = 0;
      for (local_4b8 = 0; local_4b8 < len; local_4b8 = local_4b8 + 1) {
        iVar2 = strcmp((zip->entry).name,entries[local_4b8]);
        if (iVar2 == 0) {
          bVar1 = true;
          break;
        }
      }
      if (bVar1) {
        entry_mark[err].type = MZ_DELETE;
      }
      else {
        entry_mark[err].type = MZ_KEEP;
      }
      mVar3 = mz_zip_reader_file_stat(&zip->archive,(mz_uint)err,(mz_zip_archive_file_stat *)&d_pos)
      ;
      if (mVar3 == 0) {
        return -3;
      }
      zip_entry_close(zip);
      entry_mark[err].m_local_header_ofs = file_stat._48_8_;
      entry_mark[err].file_index = -1;
      entry_mark[err].lf_length = 0;
      if ((entry_mark[err].type == MZ_DELETE) && (entry_mark[err].m_local_header_ofs < mStack_4a8))
      {
        mStack_4a8 = entry_mark[err].m_local_header_ofs;
      }
    }
    for (err = 0; (ulong)err < n; err = err + 1) {
      if ((mStack_4a8 < entry_mark[err].m_local_header_ofs) && (entry_mark[err].type != MZ_DELETE))
      {
        entry_mark[err].type = MZ_MOVE;
      }
    }
    zip_local = (zip_t *)file_stat.m_time;
  }
  return (ssize_t)zip_local;
}

Assistant:

static ssize_t zip_entry_mark(struct zip_t *zip,
                              struct zip_entry_mark_t *entry_mark,
                              const size_t n, char *const entries[],
                              const size_t len) {
  size_t i = 0;
  ssize_t err = 0;
  if (!zip || !entry_mark || !entries) {
    return ZIP_ENOINIT;
  }

  mz_zip_archive_file_stat file_stat;
  mz_uint64 d_pos = UINT64_MAX;
  for (i = 0; i < n; ++i) {
    if ((err = zip_entry_openbyindex(zip, i))) {
      return (ssize_t)err;
    }

    mz_bool name_matches = MZ_FALSE;
    {
      size_t j;
      for (j = 0; j < len; ++j) {
        if (strcmp(zip->entry.name, entries[j]) == 0) {
          name_matches = MZ_TRUE;
          break;
        }
      }
    }
    if (name_matches) {
      entry_mark[i].type = MZ_DELETE;
    } else {
      entry_mark[i].type = MZ_KEEP;
    }

    if (!mz_zip_reader_file_stat(&zip->archive, (mz_uint)i, &file_stat)) {
      return ZIP_ENOENT;
    }

    zip_entry_close(zip);

    entry_mark[i].m_local_header_ofs = file_stat.m_local_header_ofs;
    entry_mark[i].file_index = (ssize_t)-1;
    entry_mark[i].lf_length = 0;
    if ((entry_mark[i].type) == MZ_DELETE &&
        (d_pos > entry_mark[i].m_local_header_ofs)) {
      d_pos = entry_mark[i].m_local_header_ofs;
    }
  }

  for (i = 0; i < n; ++i) {
    if ((entry_mark[i].m_local_header_ofs > d_pos) &&
        (entry_mark[i].type != MZ_DELETE)) {
      entry_mark[i].type = MZ_MOVE;
    }
  }
  return err;
}